

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

mz_bool mz_zip_reader_init(mz_zip_archive *pZip,mz_uint64 size,mz_uint32 flags)

{
  mz_bool mVar1;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  mz_uint32 in_stack_00001044;
  mz_zip_archive *in_stack_00001048;
  mz_zip_archive *in_stack_ffffffffffffffd8;
  mz_bool local_4;
  
  if ((in_RDI == (undefined8 *)0x0) || (in_RDI[8] == 0)) {
    local_4 = 0;
  }
  else {
    mVar1 = (anonymous_namespace)::miniz::mz_zip_reader_init_internal(in_stack_ffffffffffffffd8,0);
    if (mVar1 == 0) {
      local_4 = 0;
    }
    else {
      *in_RDI = in_RSI;
      mVar1 = (anonymous_namespace)::miniz::mz_zip_reader_read_central_dir
                        (in_stack_00001048,in_stack_00001044);
      if (mVar1 == 0) {
        mz_zip_reader_end(in_stack_ffffffffffffffd8);
        local_4 = 0;
      }
      else {
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

mz_bool mz_zip_reader_init(mz_zip_archive *pZip, mz_uint64 size,
                           mz_uint32 flags) {
  if ((!pZip) || (!pZip->m_pRead))
    return MZ_FALSE;
  if (!mz_zip_reader_init_internal(pZip, flags))
    return MZ_FALSE;
  pZip->m_archive_size = size;
  if (!mz_zip_reader_read_central_dir(pZip, flags)) {
    mz_zip_reader_end(pZip);
    return MZ_FALSE;
  }
  return MZ_TRUE;
}